

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

int log_write_impl(char *name,size_t line,char *func,char *file,log_level_id level,char *message)

{
  log_level_id lVar1;
  int iVar2;
  log_impl impl;
  log_record_ctor_type record_ctor;
  log_record_ctor_type local_60;
  
  impl = log_singleton_get(name);
  iVar2 = 0;
  if (impl != (log_impl)0x0) {
    lVar1 = log_impl_level(impl);
    iVar2 = 0;
    if (lVar1 <= level) {
      local_60.variable_args = (log_record_va_list_type *)0x0;
      local_60.line = line;
      local_60.func = func;
      local_60.file = file;
      local_60.level = level;
      local_60.message = message;
      iVar2 = log_impl_write(impl,&local_60);
    }
  }
  return iVar2;
}

Assistant:

int log_write_impl(const char *name, const size_t line, const char *func, const char *file, const enum log_level_id level, const char *message)
{
	log_impl impl = log_singleton_get(name);

	struct log_record_ctor_type record_ctor;

	enum log_level_id impl_level;

	if (impl == NULL)
	{
		return 0;
	}

	impl_level = log_impl_level(impl);

	if (level < impl_level)
	{
		return 0;
	}

	record_ctor.line = line;
	record_ctor.func = func;
	record_ctor.file = file;
	record_ctor.level = level;
	record_ctor.message = message;
	record_ctor.variable_args = NULL;

	return log_impl_write(impl, &record_ctor);
}